

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrAtomic<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  unsigned_short uVar6;
  short sVar7;
  uint32 byteLength;
  int iVar8;
  uint uVar9;
  undefined4 *puVar10;
  WebAssemblyMemory *this_00;
  ArrayBufferBase *pAVar11;
  undefined4 extraout_var;
  unsigned_short *puVar12;
  uint *puVar13;
  int *piVar14;
  ulong uVar15;
  long *buffer_00;
  short *psVar16;
  ulong uVar17;
  uint64 index;
  byte *buffer;
  
  bVar3 = Wasm::Threads::IsEnabled();
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2356,"(Wasm::Threads::IsEnabled())","Wasm::Threads::IsEnabled()")
    ;
    if (!bVar3) goto LAB_00969eb4;
    *puVar10 = 0;
  }
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2357,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar3) goto LAB_00969eb4;
    *puVar10 = 0;
  }
  uVar9 = playout->Offset;
  uVar1 = *(uint *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4);
  this_00 = GetWebAssemblyMemory(this);
  pAVar11 = WebAssemblyMemory::GetBuffer(this_00);
  byteLength = (*(pAVar11->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(pAVar11);
  iVar8 = (*(pAVar11->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])(pAVar11);
  buffer = (byte *)CONCAT44(extraout_var,iVar8);
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
switchD_00969c16_caseD_6:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2367,"((0))","UNREACHED");
    if (bVar3) {
      *puVar10 = 0;
      return;
    }
LAB_00969eb4:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  index = (ulong)uVar1 + (ulong)uVar9;
  switch(playout->ViewType) {
  case TYPE_INT8:
    WasmArrayBoundsCheck<char>(this,index,byteLength);
    cVar4 = AtomicsOperations::Load<char>((char *)(buffer + index));
    uVar15 = (ulong)playout->Value;
    uVar9 = (uint)cVar4;
    goto LAB_00969de6;
  case TYPE_UINT8:
    WasmArrayBoundsCheck<unsigned_char>(this,index,byteLength);
    bVar5 = AtomicsOperations::Load<unsigned_char>(buffer + index);
    uVar15 = (ulong)playout->Value;
    uVar9 = (uint)bVar5;
    goto LAB_00969de6;
  case TYPE_INT16:
    psVar16 = WasmAtomicsArrayBoundsCheck<short>(this,buffer,index,byteLength);
    sVar7 = AtomicsOperations::Load<short>(psVar16);
    uVar15 = (ulong)playout->Value;
    uVar9 = (uint)sVar7;
    goto LAB_00969de6;
  case TYPE_UINT16:
    puVar12 = WasmAtomicsArrayBoundsCheck<unsigned_short>(this,buffer,index,byteLength);
    uVar6 = AtomicsOperations::Load<unsigned_short>(puVar12);
    uVar15 = (ulong)playout->Value;
    uVar9 = (uint)uVar6;
    goto LAB_00969de6;
  case TYPE_INT32:
    piVar14 = WasmAtomicsArrayBoundsCheck<int>(this,buffer,index,byteLength);
    uVar9 = AtomicsOperations::Load<int>(piVar14);
    goto LAB_00969cda;
  case TYPE_UINT32:
    puVar13 = WasmAtomicsArrayBoundsCheck<unsigned_int>(this,buffer,index,byteLength);
    uVar9 = AtomicsOperations::Load<unsigned_int>(puVar13);
LAB_00969cda:
    uVar15 = (ulong)playout->Value;
LAB_00969de6:
    *(uint *)(*(long *)(this + 0x118) + uVar15 * 4) = uVar9;
    return;
  default:
    goto switchD_00969c16_caseD_6;
  case TYPE_INT64:
    buffer_00 = WasmAtomicsArrayBoundsCheck<long>(this,buffer,index,byteLength);
    uVar15 = AtomicsOperations::Load<long>(buffer_00);
    uVar17 = (ulong)playout->Value;
    break;
  case TYPE_INT8_TO_INT64:
    WasmArrayBoundsCheck<char>(this,index,byteLength);
    cVar4 = AtomicsOperations::Load<char>((char *)(buffer + index));
    uVar17 = (ulong)playout->Value;
    uVar15 = (ulong)cVar4;
    break;
  case TYPE_UINT8_TO_INT64:
    WasmArrayBoundsCheck<unsigned_char>(this,index,byteLength);
    bVar5 = AtomicsOperations::Load<unsigned_char>(buffer + index);
    uVar17 = (ulong)playout->Value;
    uVar15 = (ulong)bVar5;
    break;
  case TYPE_INT16_TO_INT64:
    psVar16 = WasmAtomicsArrayBoundsCheck<short>(this,buffer,index,byteLength);
    sVar7 = AtomicsOperations::Load<short>(psVar16);
    uVar17 = (ulong)playout->Value;
    uVar15 = (ulong)sVar7;
    break;
  case TYPE_UINT16_TO_INT64:
    puVar12 = WasmAtomicsArrayBoundsCheck<unsigned_short>(this,buffer,index,byteLength);
    uVar6 = AtomicsOperations::Load<unsigned_short>(puVar12);
    uVar17 = (ulong)playout->Value;
    uVar15 = (ulong)uVar6;
    break;
  case TYPE_INT32_TO_INT64:
    piVar14 = WasmAtomicsArrayBoundsCheck<int>(this,buffer,index,byteLength);
    iVar8 = AtomicsOperations::Load<int>(piVar14);
    uVar17 = (ulong)playout->Value;
    uVar15 = (ulong)iVar8;
    break;
  case TYPE_UINT32_TO_INT64:
    puVar13 = WasmAtomicsArrayBoundsCheck<unsigned_int>(this,buffer,index,byteLength);
    uVar9 = AtomicsOperations::Load<unsigned_int>(puVar13);
    uVar17 = (ulong)playout->Value;
    uVar15 = (ulong)uVar9;
  }
  *(ulong *)(*(long *)(this + 0x120) + uVar17 * 8) = uVar15;
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdArrAtomic(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        Assert(Wasm::Threads::IsEnabled());
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = playout->Offset + (uint64)(uint32)GetRegRawInt(playout->SlotIndex);
        ArrayBufferBase* arr = GetWebAssemblyMemory()->GetBuffer();

        uint32 byteLength = arr->GetByteLength();
        BYTE* buffer = arr->GetBuffer();
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW_INT(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: {\
            MemType* readBuffer = WasmAtomicsArrayBoundsCheck<MemType>(buffer, index, byteLength); \
            MemType value = AtomicsOperations::Load<MemType>(readBuffer); \
            SetRegRaw<RegType>(playout->Value, (RegType)value); \
            return; \
        }
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
#else
        Assert(UNREACHED);
#endif
    }